

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SelectionCompiler.cpp
# Opt level: O1

string * __thiscall
OpenMD::SelectionCompiler::getUnescapedStringLiteral_abi_cxx11_
          (string *__return_storage_ptr__,SelectionCompiler *this)

{
  char cVar1;
  pointer pcVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint uVar7;
  ulong uVar8;
  
  iVar4 = this->cchToken;
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct((ulong)__return_storage_ptr__,(char)iVar4 + -2);
  iVar4 = this->ichToken + this->cchToken + -1;
  uVar3 = this->ichToken + 1;
  do {
    if (iVar4 <= (int)uVar3) {
      return __return_storage_ptr__;
    }
    pcVar2 = (this->script)._M_dataplus._M_p;
    uVar8 = (long)(int)uVar3 + 1;
    if ((pcVar2[(int)uVar3] == '\\') && ((int)uVar8 < iVar4)) {
      uVar7 = uVar3 + 2;
      switch(pcVar2[uVar8]) {
      case 'n':
        break;
      case 'o':
      case 'p':
      case 'q':
      case 's':
      case 'v':
      case 'w':
        break;
      case 'r':
        break;
      case 't':
        break;
      case 'u':
      case 'x':
        if ((int)uVar7 < iVar4) {
          iVar5 = (uint)(pcVar2[uVar8] != 'x') * 2 + 2;
          uVar8 = (ulong)(int)uVar7;
          uVar3 = ~uVar3;
          do {
            if ((iVar5 < 1) || ((long)iVar4 <= (long)uVar8)) goto LAB_0026f63d;
            cVar1 = pcVar2[uVar8];
            iVar6 = (int)cVar1;
            if ((byte)(cVar1 - 0x30U) < 10) {
              uVar7 = iVar6 - 0x30;
            }
            else if ((byte)(cVar1 + 0x9fU) < 6) {
              uVar7 = iVar6 - 0x57;
            }
            else {
              uVar7 = iVar6 - 0x37;
              if (5 < (byte)(cVar1 + 0xbfU)) {
                uVar7 = 0xffffffff;
              }
            }
            uVar8 = uVar8 + 1;
            uVar3 = uVar3 - 1;
            iVar5 = iVar5 + -1;
          } while (-1 < (int)uVar7);
          uVar8 = (ulong)(-uVar3 - ((int)~uVar7 >> 0x1f));
          goto LAB_0026f63d;
        }
        break;
      default:
      }
      uVar8 = (ulong)uVar7;
    }
LAB_0026f63d:
    std::__cxx11::string::_M_replace_aux
              ((ulong)__return_storage_ptr__,__return_storage_ptr__->_M_string_length,0,'\x01');
    uVar3 = (uint)uVar8;
  } while( true );
}

Assistant:

std::string SelectionCompiler::getUnescapedStringLiteral() {
    /** @todo */
    std::string sb(cchToken - 2, ' ');

    int ichMax = ichToken + cchToken - 1;
    int ich    = ichToken + 1;

    while (ich < ichMax) {
      char ch = script[ich++];
      if (ch == '\\' && ich < ichMax) {
        ch = script[ich++];
        switch (ch) {
        case 'b':
          ch = '\b';
          break;
        case 'n':
          ch = '\n';
          break;
        case 't':
          ch = '\t';
          break;
        case 'r':
          ch = '\r';
          // fall into
        case '"':
        case '\\':
        case '\'':
          break;
        case 'x':
        case 'u':
          int digitCount = ch == 'x' ? 2 : 4;
          if (ich < ichMax) {
            int unicode = 0;
            for (int k = digitCount; --k >= 0 && ich < ichMax;) {
              char chT  = script[ich];
              int hexit = getHexitValue(chT);
              if (hexit < 0) break;
              unicode <<= 4;
              unicode += hexit;
              ++ich;
            }
            ch = (char)unicode;
          }
        }
      }
      sb.append(1, ch);
    }

    return sb;
  }